

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O0

Frame * __thiscall Frame::prepend(Frame *this,void *data,size_t size)

{
  uint8_t *puVar1;
  pointer puVar2;
  ulong uVar3;
  uchar *__p;
  uint8_t *newData;
  size_t bytesFree;
  size_t size_local;
  void *data_local;
  Frame *this_local;
  
  puVar1 = this->m_Pos;
  puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (&this->m_Data);
  uVar3 = (long)puVar1 - (long)puVar2;
  if (uVar3 < size) {
    __p = (uchar *)operator_new__(size + this->m_Size);
    this->m_Pos = __p + size + uVar3;
    puVar1 = this->m_Pos;
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&this->m_Data);
    memcpy(puVar1,puVar2 + uVar3,this->m_Size - uVar3);
    std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
    reset<unsigned_char*,void>
              ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)this,__p);
    this->m_Size = size + this->m_Size;
    this->m_OriginalSize = this->m_Size;
    puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&this->m_Data);
    this->m_Pos = puVar2 + uVar3;
  }
  else {
    this->m_Pos = this->m_Pos + -size;
  }
  memcpy(this->m_Pos,data,size);
  return this;
}

Assistant:

Frame& Frame::prepend(const void* const data, const size_t size)
{
    const size_t bytesFree = m_Pos - m_Data.get();
    if (size > bytesFree) {
        auto newData = new uint8_t[size + m_Size];

        m_Pos = newData + bytesFree + size;
        memcpy(m_Pos, m_Data.get() + bytesFree, m_Size - bytesFree);
        m_Data.reset(newData);
        m_Size += size;
        m_OriginalSize = m_Size;
        m_Pos = m_Data.get() + bytesFree;
    } else {
        m_Pos -= size;
    }
    memcpy(m_Pos, data, size);
    return *this;
}